

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s_Simd128.c
# Opt level: O2

Hacl_Hash_Blake2s_Simd128_state_t *
Hacl_Hash_Blake2s_Simd128_copy(Hacl_Hash_Blake2s_Simd128_state_t *state)

{
  Lib_IntVector_Intrinsics_vec128 *palVar1;
  uint8_t *puVar2;
  uint64_t uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  longlong lVar19;
  longlong lVar20;
  longlong lVar21;
  longlong lVar22;
  longlong lVar23;
  longlong lVar24;
  longlong lVar25;
  uint8_t uVar26;
  uint8_t uVar27;
  uint8_t *puVar28;
  Lib_IntVector_Intrinsics_vec128 *palVar29;
  Lib_IntVector_Intrinsics_vec128 *palVar30;
  Hacl_Hash_Blake2s_Simd128_state_t *pHVar31;
  
  uVar26 = (state->block_state).fst;
  uVar27 = (state->block_state).snd;
  palVar1 = (state->block_state).thd.snd;
  puVar2 = state->buf;
  uVar3 = state->total_len;
  puVar28 = (uint8_t *)calloc(0x40,1);
  uVar4 = *(undefined4 *)(puVar2 + 4);
  uVar5 = *(undefined4 *)(puVar2 + 8);
  uVar6 = *(undefined4 *)(puVar2 + 0xc);
  uVar7 = *(undefined4 *)(puVar2 + 0x10);
  uVar8 = *(undefined4 *)(puVar2 + 0x14);
  uVar9 = *(undefined4 *)(puVar2 + 0x18);
  uVar10 = *(undefined4 *)(puVar2 + 0x1c);
  uVar11 = *(undefined4 *)(puVar2 + 0x20);
  uVar12 = *(undefined4 *)(puVar2 + 0x24);
  uVar13 = *(undefined4 *)(puVar2 + 0x28);
  uVar14 = *(undefined4 *)(puVar2 + 0x2c);
  uVar15 = *(undefined4 *)(puVar2 + 0x30);
  uVar16 = *(undefined4 *)(puVar2 + 0x34);
  uVar17 = *(undefined4 *)(puVar2 + 0x38);
  uVar18 = *(undefined4 *)(puVar2 + 0x3c);
  *(undefined4 *)puVar28 = *(undefined4 *)puVar2;
  *(undefined4 *)(puVar28 + 4) = uVar4;
  *(undefined4 *)(puVar28 + 8) = uVar5;
  *(undefined4 *)(puVar28 + 0xc) = uVar6;
  *(undefined4 *)(puVar28 + 0x10) = uVar7;
  *(undefined4 *)(puVar28 + 0x14) = uVar8;
  *(undefined4 *)(puVar28 + 0x18) = uVar9;
  *(undefined4 *)(puVar28 + 0x1c) = uVar10;
  *(undefined4 *)(puVar28 + 0x20) = uVar11;
  *(undefined4 *)(puVar28 + 0x24) = uVar12;
  *(undefined4 *)(puVar28 + 0x28) = uVar13;
  *(undefined4 *)(puVar28 + 0x2c) = uVar14;
  *(undefined4 *)(puVar28 + 0x30) = uVar15;
  *(undefined4 *)(puVar28 + 0x34) = uVar16;
  *(undefined4 *)(puVar28 + 0x38) = uVar17;
  *(undefined4 *)(puVar28 + 0x3c) = uVar18;
  palVar29 = (Lib_IntVector_Intrinsics_vec128 *)aligned_alloc(0x10,0x40);
  (*palVar29)[0] = 0;
  (*palVar29)[1] = 0;
  palVar29[1][0] = 0;
  palVar29[1][1] = 0;
  palVar29[2][0] = 0;
  palVar29[2][1] = 0;
  palVar29[3][0] = 0;
  palVar29[3][1] = 0;
  palVar30 = (Lib_IntVector_Intrinsics_vec128 *)aligned_alloc(0x10,0x40);
  lVar19 = (*palVar1)[1];
  lVar20 = palVar1[1][0];
  lVar21 = palVar1[1][1];
  lVar22 = palVar1[2][0];
  lVar23 = palVar1[2][1];
  lVar24 = palVar1[3][0];
  lVar25 = palVar1[3][1];
  (*palVar30)[0] = (*palVar1)[0];
  (*palVar30)[1] = lVar19;
  palVar30[1][0] = lVar20;
  palVar30[1][1] = lVar21;
  palVar30[2][0] = lVar22;
  palVar30[2][1] = lVar23;
  palVar30[3][0] = lVar24;
  palVar30[3][1] = lVar25;
  pHVar31 = (Hacl_Hash_Blake2s_Simd128_state_t *)malloc(0x28);
  (pHVar31->block_state).fst = uVar26;
  (pHVar31->block_state).snd = uVar27;
  (pHVar31->block_state).thd.fst = palVar29;
  (pHVar31->block_state).thd.snd = palVar30;
  pHVar31->buf = puVar28;
  pHVar31->total_len = uVar3;
  return pHVar31;
}

Assistant:

Hacl_Hash_Blake2s_Simd128_state_t
*Hacl_Hash_Blake2s_Simd128_copy(Hacl_Hash_Blake2s_Simd128_state_t *state)
{
  Hacl_Hash_Blake2s_Simd128_state_t scrut = *state;
  Hacl_Hash_Blake2s_Simd128_block_state_t block_state0 = scrut.block_state;
  uint8_t *buf0 = scrut.buf;
  uint64_t total_len0 = scrut.total_len;
  uint8_t nn = block_state0.snd;
  uint8_t kk1 = block_state0.fst;
  Hacl_Hash_Blake2b_index i = { .key_length = kk1, .digest_length = nn };
  uint8_t *buf = (uint8_t *)KRML_HOST_CALLOC(64U, sizeof (uint8_t));
  memcpy(buf, buf0, 64U * sizeof (uint8_t));
  Lib_IntVector_Intrinsics_vec128
  *wv =
    (Lib_IntVector_Intrinsics_vec128 *)KRML_ALIGNED_MALLOC(16,
      sizeof (Lib_IntVector_Intrinsics_vec128) * 4U);
  memset(wv, 0U, 4U * sizeof (Lib_IntVector_Intrinsics_vec128));
  Lib_IntVector_Intrinsics_vec128
  *b =
    (Lib_IntVector_Intrinsics_vec128 *)KRML_ALIGNED_MALLOC(16,
      sizeof (Lib_IntVector_Intrinsics_vec128) * 4U);
  memset(b, 0U, 4U * sizeof (Lib_IntVector_Intrinsics_vec128));
  Hacl_Hash_Blake2s_Simd128_block_state_t
  block_state = { .fst = i.key_length, .snd = i.digest_length, .thd = { .fst = wv, .snd = b } };
  Lib_IntVector_Intrinsics_vec128 *src_b = block_state0.thd.snd;
  Lib_IntVector_Intrinsics_vec128 *dst_b = block_state.thd.snd;
  memcpy(dst_b, src_b, 4U * sizeof (Lib_IntVector_Intrinsics_vec128));
  Hacl_Hash_Blake2s_Simd128_state_t
  s = { .block_state = block_state, .buf = buf, .total_len = total_len0 };
  Hacl_Hash_Blake2s_Simd128_state_t
  *p =
    (Hacl_Hash_Blake2s_Simd128_state_t *)KRML_HOST_MALLOC(sizeof (
        Hacl_Hash_Blake2s_Simd128_state_t
      ));
  p[0U] = s;
  return p;
}